

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O0

QStringList * __thiscall QAccessibleMenuItem::actionNames(QAccessibleMenuItem *this)

{
  ulong uVar1;
  QMenu *pQVar2;
  long in_RSI;
  QStringList *in_RDI;
  QStringList *actions;
  parameter_type in_stack_ffffffffffffffc8;
  QStringList *this_00;
  
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QString>::QList((QList<QString> *)0x7dbf23);
  if ((*(long *)(in_RSI + 0x10) != 0) && (uVar1 = QAction::isSeparator(), (uVar1 & 1) == 0)) {
    pQVar2 = QAction::menu<QMenu*>((QAction *)0x7dbf60);
    if (pQVar2 == (QMenu *)0x0) {
      QAccessibleActionInterface::pressAction();
      QList<QString>::operator<<(this_00,in_stack_ffffffffffffffc8);
    }
    else {
      QAccessibleActionInterface::showMenuAction();
      QList<QString>::operator<<(this_00,in_stack_ffffffffffffffc8);
    }
  }
  return in_RDI;
}

Assistant:

QStringList QAccessibleMenuItem::actionNames() const
{
    QStringList actions;
    if (!m_action || m_action->isSeparator())
        return actions;

    if (m_action->menu()) {
        actions << showMenuAction();
    } else {
        actions << pressAction();
    }
    return actions;
}